

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

int xmlStreamCtxtAddState(xmlStreamCtxtPtr comp,int idx,int level)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  
  iVar1 = comp->nbState;
  if (0 < (long)iVar1) {
    piVar3 = comp->states;
    uVar2 = 0;
    do {
      if (piVar3[uVar2 * 2] < 0) {
        piVar3[uVar2 * 2] = idx;
        piVar3[uVar2 * 2 + 1] = level;
        goto LAB_0016db0e;
      }
      uVar2 = uVar2 + 1;
    } while ((long)iVar1 != uVar2);
  }
  if (comp->maxState <= iVar1) {
    piVar3 = (int *)(*xmlRealloc)(comp->states,(long)comp->maxState << 4);
    if (piVar3 == (int *)0x0) {
      uVar2 = 0xffffffff;
      goto LAB_0016db0e;
    }
    comp->states = piVar3;
    comp->maxState = comp->maxState << 1;
  }
  piVar3 = comp->states;
  piVar3[(long)comp->nbState * 2] = idx;
  iVar1 = comp->nbState;
  comp->nbState = iVar1 + 1;
  piVar3[(long)iVar1 * 2 + 1] = level;
  uVar2 = (ulong)(comp->nbState - 1);
LAB_0016db0e:
  return (int)uVar2;
}

Assistant:

static int
xmlStreamCtxtAddState(xmlStreamCtxtPtr comp, int idx, int level) {
    int i;
    for (i = 0;i < comp->nbState;i++) {
        if (comp->states[2 * i] < 0) {
	    comp->states[2 * i] = idx;
	    comp->states[2 * i + 1] = level;
	    return(i);
	}
    }
    if (comp->nbState >= comp->maxState) {
        int *cur;

	cur = (int *) xmlRealloc(comp->states,
				 comp->maxState * 4 * sizeof(int));
	if (cur == NULL) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamCtxt: malloc failed\n");
	    return(-1);
	}
	comp->states = cur;
        comp->maxState *= 2;
    }
    comp->states[2 * comp->nbState] = idx;
    comp->states[2 * comp->nbState++ + 1] = level;
    return(comp->nbState - 1);
}